

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::BeginGroup(void)

{
  ImGuiWindow *pIVar1;
  ImGuiGroupData *pIVar2;
  ImGuiContext *pIVar3;
  long lVar4;
  float fVar5;
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  ImVector<ImGuiGroupData>::resize(&GImGui->GroupStack,(GImGui->GroupStack).Size + 1);
  pIVar2 = (pIVar3->GroupStack).Data;
  lVar4 = (long)(pIVar3->GroupStack).Size;
  pIVar2[lVar4 + -1].WindowID = pIVar1->ID;
  pIVar2[lVar4 + -1].BackupCursorPos = (pIVar1->DC).CursorPos;
  pIVar2[lVar4 + -1].BackupCursorMaxPos = (pIVar1->DC).CursorMaxPos;
  pIVar2[lVar4 + -1].BackupIndent.x = (pIVar1->DC).Indent.x;
  pIVar2[lVar4 + -1].BackupGroupOffset.x = (pIVar1->DC).GroupOffset.x;
  pIVar2[lVar4 + -1].BackupCurrLineSize = (pIVar1->DC).CurrLineSize;
  pIVar2[lVar4 + -1].BackupCurrLineTextBaseOffset = (pIVar1->DC).CurrLineTextBaseOffset;
  pIVar2[lVar4 + -1].BackupActiveIdIsAlive = pIVar3->ActiveIdIsAlive;
  pIVar2[lVar4 + -1].BackupActiveIdPreviousFrameIsAlive = pIVar3->ActiveIdPreviousFrameIsAlive;
  pIVar2[lVar4 + -1].EmitItem = true;
  fVar5 = ((pIVar1->DC).CursorPos.x - (pIVar1->Pos).x) - (pIVar1->DC).ColumnsOffset.x;
  (pIVar1->DC).GroupOffset.x = fVar5;
  (pIVar1->DC).Indent.x = fVar5;
  (pIVar1->DC).CursorMaxPos = (pIVar1->DC).CursorPos;
  (pIVar1->DC).CurrLineSize.x = 0.0;
  (pIVar1->DC).CurrLineSize.y = 0.0;
  if (pIVar3->LogEnabled == true) {
    pIVar3->LogLinePosY = -3.4028235e+38;
  }
  return;
}

Assistant:

void ImGui::BeginGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    g.GroupStack.resize(g.GroupStack.Size + 1);
    ImGuiGroupData& group_data = g.GroupStack.back();
    group_data.WindowID = window->ID;
    group_data.BackupCursorPos = window->DC.CursorPos;
    group_data.BackupCursorMaxPos = window->DC.CursorMaxPos;
    group_data.BackupIndent = window->DC.Indent;
    group_data.BackupGroupOffset = window->DC.GroupOffset;
    group_data.BackupCurrLineSize = window->DC.CurrLineSize;
    group_data.BackupCurrLineTextBaseOffset = window->DC.CurrLineTextBaseOffset;
    group_data.BackupActiveIdIsAlive = g.ActiveIdIsAlive;
    group_data.BackupActiveIdPreviousFrameIsAlive = g.ActiveIdPreviousFrameIsAlive;
    group_data.EmitItem = true;

    window->DC.GroupOffset.x = window->DC.CursorPos.x - window->Pos.x - window->DC.ColumnsOffset.x;
    window->DC.Indent = window->DC.GroupOffset;
    window->DC.CursorMaxPos = window->DC.CursorPos;
    window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce a carriage return
}